

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::AtomicRMW*,wasm::Type>
          (ValidationInfo *this,Type left,Type right,AtomicRMW *curr,char *text,Function *func)

{
  bool bVar1;
  ostream *poVar2;
  bool local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  ValidationInfo *local_1e0;
  uintptr_t local_1c8;
  ostringstream local_1c0 [8];
  ostringstream ss;
  BasicType local_44;
  Function *local_40;
  Function *func_local;
  char *text_local;
  AtomicRMW *curr_local;
  ValidationInfo *this_local;
  Type right_local;
  Type left_local;
  
  local_44 = unreachable;
  local_40 = func;
  func_local = (Function *)text;
  text_local = (char *)curr;
  curr_local = (AtomicRMW *)this;
  this_local = (ValidationInfo *)right.id;
  right_local = left;
  bVar1 = wasm::Type::operator!=(&right_local,&local_44);
  local_201 = false;
  if (bVar1) {
    local_201 = wasm::Type::operator!=(&right_local,(Type *)&this_local);
  }
  if (local_201 != false) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    local_1c8 = right_local.id;
    poVar2 = wasm::operator<<((ostream *)local_1c0,right_local);
    poVar2 = std::operator<<(poVar2," != ");
    local_1e0 = this_local;
    poVar2 = wasm::operator<<(poVar2,(Type)this_local);
    poVar2 = std::operator<<(poVar2,": ");
    std::operator<<(poVar2,(char *)func_local);
    std::__cxx11::ostringstream::str();
    fail<wasm::AtomicRMW*,std::__cxx11::string>(this,&local_200,(AtomicRMW *)text_local,local_40);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  left_local.id._7_1_ = local_201 == false;
  return left_local.id._7_1_;
}

Assistant:

bool shouldBeEqualOrFirstIsUnreachable(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != Type::unreachable && left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }